

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::write<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,char *value)

{
  size_t sVar1;
  format_error *this;
  
  if (value != (char *)0x0) {
    sVar1 = strlen(value);
    buffer<char>::append<char>
              ((buffer<char> *)
               out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,value,
               value + sVar1);
    return (buffer_appender<char>)
           out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
  }
  this = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this,"string pointer is null");
  __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

OutputIt write(OutputIt out, const Char* value) {
  if (!value) {
    FMT_THROW(format_error("string pointer is null"));
  } else {
    auto length = std::char_traits<Char>::length(value);
    out = write(out, basic_string_view<Char>(value, length));
  }
  return out;
}